

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scrollbar.H
# Opt level: O1

void Fl_Text_Display::v_scrollbar_cb(Fl_Scrollbar *b,Fl_Text_Display *textD)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  iVar1 = (int)(b->super_Fl_Slider).super_Fl_Valuator.value_;
  if (textD->mTopLineNum == iVar1) {
    return;
  }
  textD->mTopLineNumHint = iVar1;
  textD->mHorizOffsetHint = textD->mHorizOffset;
  UNRECOVERED_JUMPTABLE = (textD->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4];
  (*UNRECOVERED_JUMPTABLE)
            (textD,(ulong)(uint)(textD->super_Fl_Group).super_Fl_Widget.x_,
             (ulong)(uint)(textD->super_Fl_Group).super_Fl_Widget.y_,
             (ulong)(uint)(textD->super_Fl_Group).super_Fl_Widget.w_,
             (ulong)(uint)(textD->super_Fl_Group).super_Fl_Widget.h_,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

int value() const {return int(Fl_Slider::value());}